

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

unsigned_short __thiscall
math::wide_integer::uintwide_t::operator_cast_to_unsigned_short(uintwide_t *this)

{
  uintwide_t<256U,_unsigned_short,_void,_true> tmp;
  uintwide_t<256U,_unsigned_short,_void,_true> local_28;
  
  if (-1 < *(short *)(this + 0x1e)) {
    return *(unsigned_short *)this;
  }
  local_28.values.super_array<unsigned_short,_16UL>.elems._0_8_ = *(undefined8 *)this;
  local_28.values.super_array<unsigned_short,_16UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  local_28.values.super_array<unsigned_short,_16UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_28.values.super_array<unsigned_short,_16UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  uintwide_t<256U,_unsigned_short,_void,_true>::negate(&local_28);
  return -local_28.values.super_array<unsigned_short,_16UL>.elems[0];
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }